

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O3

int Pdr_ManCheckCube(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,int nConfLimit,
                    int fTryConf,int fUseLit)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  abctime aVar5;
  Vec_Ptr_t *pVVar6;
  uint Entry;
  Pdr_Set_t **ppPVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  sat_solver *s;
  Vec_Int_t *pVVar11;
  long lVar12;
  Pdr_Set_t *pPVar13;
  long lVar14;
  long lVar15;
  int Lit;
  timespec ts;
  uint local_54;
  timespec local_50;
  int local_40;
  int local_3c;
  Pdr_Set_t **local_38;
  
  p->nCalls = p->nCalls + 1;
  local_3c = fTryConf;
  s = Pdr_ManFetchSolver(p,k);
  local_40 = k;
  local_38 = ppPred;
  if (pCube == (Pdr_Set_t *)0x0) {
    iVar8 = clock_gettime(3,&local_50);
    if (iVar8 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    iVar8 = p->iOutCur;
    if (((long)iVar8 < 0) || (pVVar6 = p->pAig->vCos, pVVar6->nSize <= iVar8)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    iVar8 = Pdr_ObjSatVar(p,k,2,(Aig_Obj_t *)pVVar6->pArray[iVar8]);
    if (iVar8 < 0) {
LAB_005fc66e:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    local_54 = iVar8 * 2;
    lVar14 = p->timeToStop;
    lVar4 = p->timeToStopOne;
    lVar12 = lVar4;
    if (((lVar14 != 0) && (lVar12 = lVar14, lVar4 != 0)) && (lVar12 = lVar4, lVar14 < lVar4)) {
      lVar12 = lVar14;
    }
    aVar5 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar12;
    iVar8 = sat_solver_solve(s,(lit *)&local_54,(lit *)&local_50,(long)nConfLimit,0,0,0);
    s->nRuntimeLimit = aVar5;
    if (iVar8 == 0) {
      return -1;
    }
  }
  else {
    if (fUseLit == 0) {
      pVVar11 = Pdr_ManCubeToLits(p,k,pCube,0,1);
    }
    else {
      if ((k < 0) || (p->vActVars->nSize <= k)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = p->vActVars->pArray + (uint)k;
      *piVar1 = *piVar1 + 1;
      pVVar11 = Pdr_ManCubeToLits(p,k,pCube,1,0);
      iVar8 = Pdr_ManFreeVar(p,k);
      if (iVar8 < 0) goto LAB_005fc66e;
      Entry = iVar8 * 2;
      local_54 = Entry;
      Vec_IntPush(pVVar11,Entry);
      iVar8 = sat_solver_addclause(s,pVVar11->pArray,pVVar11->pArray + pVVar11->nSize);
      if (iVar8 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                      ,0x143,
                      "int Pdr_ManCheckCube(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, int, int, int)"
                     );
      }
      if ((s->qtail != s->qhead) && (iVar8 = sat_solver_simplify(s), iVar8 == 0)) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0x102,"void sat_solver_compress(sat_solver *)");
      }
      pVVar11 = Pdr_ManCubeToLits(p,k,pCube,0,1);
      Vec_IntPush(pVVar11,Entry | 1);
    }
    iVar8 = clock_gettime(3,&local_50);
    if (iVar8 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    lVar14 = p->timeToStop;
    lVar4 = p->timeToStopOne;
    lVar12 = lVar4;
    if (((lVar14 != 0) && (lVar12 = lVar14, lVar4 != 0)) && (lVar12 = lVar4, lVar14 < lVar4)) {
      lVar12 = lVar14;
    }
    aVar5 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar12;
    if (local_3c != 0) {
      nConfLimit = p->pPars->nConfGenLimit;
    }
    iVar8 = sat_solver_solve(s,pVVar11->pArray,pVVar11->pArray + pVVar11->nSize,(long)nConfLimit,0,0
                             ,0);
    s->nRuntimeLimit = aVar5;
    if (iVar8 == 0) {
      if (local_3c == 0) {
        return -1;
      }
      iVar8 = 1;
      if (p->pPars->nConfGenLimit == 0) {
        return -1;
      }
    }
  }
  iVar9 = clock_gettime(3,&local_50);
  ppPVar7 = local_38;
  iVar10 = local_40;
  if (iVar9 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  lVar14 = lVar14 - lVar15;
  p->tSat = p->tSat + lVar14;
  if (iVar8 == -1) {
    p->tSatUnsat = p->tSatUnsat + lVar14;
    p->nCallsU = p->nCallsU + 1;
    iVar8 = 1;
    if (local_38 != (Pdr_Set_t **)0x0) {
      *local_38 = (Pdr_Set_t *)0x0;
    }
  }
  else {
    p->tSatSat = p->tSatSat + lVar14;
    p->nCallsS = p->nCallsS + 1;
    iVar8 = 0;
    if (local_38 != (Pdr_Set_t **)0x0) {
      iVar9 = clock_gettime(3,&local_50);
      if (iVar9 < 0) {
        lVar15 = 1;
      }
      else {
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
        lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_50.tv_sec * -1000000;
      }
      if (p->pPars->fNewXSim == 0) {
        pPVar13 = Pdr_ManTernarySim(p,iVar10,pCube);
      }
      else {
        pPVar13 = Txs3_ManTernarySim(p->pTxs3,iVar10,pCube);
      }
      *ppPVar7 = pPVar13;
      iVar10 = clock_gettime(3,&local_50);
      if (iVar10 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->tTsim = p->tTsim + lVar14 + lVar15;
      uVar2 = p->nXsimRuns;
      uVar3 = p->nXsimLits;
      iVar10 = (*ppPVar7)->nLits;
      p->nXsimRuns = uVar2 + 1;
      p->nXsimLits = iVar10 + uVar3;
    }
  }
  return iVar8;
}

Assistant:

int Pdr_ManCheckCube( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, int nConfLimit, int fTryConf, int fUseLit )
{ 
    //int fUseLit = 0;
    int fLitUsed = 0;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int Lit, RetValue;
    abctime clk, Limit;
    p->nCalls++;
    pSat = Pdr_ManFetchSolver( p, k );
    if ( pCube == NULL ) // solve the property
    {
        clk = Abc_Clock();
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, k, 2, Aig_ManCo(p->pAig, p->iOutCur)), 0 ); // pos literal (property fails)
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, &Lit, &Lit + 1, nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
    }
    else // check relative containment in terms of next states
    {
        if ( fUseLit )
        {
            fLitUsed = 1;
            Vec_IntAddToEntry( p->vActVars, k, 1 );
            // add the cube in terms of current state variables
            vLits = Pdr_ManCubeToLits( p, k, pCube, 1, 0 );
            // add activation literal
            Lit = Abc_Var2Lit( Pdr_ManFreeVar(p, k), 0 );
            // add activation literal
            Vec_IntPush( vLits, Lit );
            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            sat_solver_compress( pSat );
            // create assumptions
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );
            // add activation literal
            Vec_IntPush( vLits, Abc_LitNot(Lit) );
        }
        else
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );

        // solve 
        clk = Abc_Clock();
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), fTryConf ? p->pPars->nConfGenLimit : nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
        {
            if ( fTryConf && p->pPars->nConfGenLimit )
                RetValue = l_True;
            else
                return -1;
        }
    }
    clk = Abc_Clock() - clk;
    p->tSat += clk;
    assert( RetValue != l_Undef );
    if ( RetValue == l_False )
    {
        p->tSatUnsat += clk;
        p->nCallsU++;
        if ( ppPred )
            *ppPred = NULL;
        RetValue = 1;
    }
    else // if ( RetValue == l_True )
    {
        p->tSatSat += clk;
        p->nCallsS++;
        if ( ppPred )
        {
            abctime clk = Abc_Clock();
            if ( p->pPars->fNewXSim )
                *ppPred = Txs3_ManTernarySim( p->pTxs3, k, pCube );
            else
                *ppPred = Pdr_ManTernarySim( p, k, pCube );
            p->tTsim += Abc_Clock() - clk;
            p->nXsimLits += (*ppPred)->nLits;
            p->nXsimRuns++;
        }
        RetValue = 0;
    }

/* // for some reason, it does not work...
    if ( fLitUsed )
    {
        int RetValue;
        Lit = Abc_LitNot(Lit);
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
        sat_solver_compress( pSat );
    }
*/
    return RetValue;
}